

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DebugNodeDrawList
               (ImGuiWindow *window,ImGuiViewportP *viewport,ImDrawList *draw_list,char *label)

{
  long lVar1;
  uint uVar2;
  ImGuiWindow *pIVar3;
  ImDrawVert *pIVar4;
  ImGuiContext *pIVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  ImGuiWindow *window_1;
  ImDrawList *this;
  ulong uVar10;
  bool show_mesh;
  char *pcVar11;
  uint uVar12;
  ImDrawCmd *pIVar13;
  uint uVar14;
  ImVec4 *buf_00;
  int iVar15;
  long lVar16;
  uint *puVar17;
  ulong uVar18;
  undefined4 uVar19;
  float fVar20;
  ImGuiListClipper clipper;
  ImVec2 triangle_1 [3];
  char texid_desc [20];
  char buf [300];
  undefined1 local_1f8 [8];
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  double local_1d8;
  void *pvStack_1d0;
  ImDrawList *local_1c8;
  long local_1c0;
  ulong local_1b8;
  ImVec2 local_1b0;
  ImVec2 local_1a8 [4];
  char local_188 [32];
  ImVec4 local_168 [18];
  undefined1 local_3c [12];
  
  pIVar5 = GImGui;
  iVar15 = (draw_list->CmdBuffer).Size;
  lVar16 = (long)iVar15;
  if ((0 < lVar16) && (pIVar13 = (draw_list->CmdBuffer).Data, pIVar13[lVar16 + -1].ElemCount == 0))
  {
    iVar15 = iVar15 - (uint)(pIVar13[lVar16 + -1].UserCallback == (ImDrawCallback)0x0);
  }
  pcVar11 = "";
  if (draw_list->_OwnerName != (char *)0x0) {
    pcVar11 = draw_list->_OwnerName;
  }
  bVar7 = TreeNode(draw_list,"%s: \'%s\' %d vtx, %d indices, %d cmds",label,pcVar11,
                   (ulong)(uint)(draw_list->VtxBuffer).Size,(ulong)(uint)(draw_list->IdxBuffer).Size
                   ,iVar15);
  pIVar6 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  pIVar3->WriteAccessed = true;
  if (pIVar3->DrawList == draw_list) {
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (pIVar6->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
      (pIVar3->DC).IsSameLine = true;
    }
    local_168[0].x = 1.0;
    local_168[0].y = 0.4;
    local_168[0].z = 0.4;
    local_168[0].w = 1.0;
    TextColored(local_168,"CURRENTLY APPENDING");
    if (!bVar7) {
      return;
    }
  }
  else {
    this = GetViewportBgFgDrawList(*(pIVar6->Viewports).Data,1,"##Foreground");
    if (window == (ImGuiWindow *)0x0) {
      if (!bVar7) {
        return;
      }
    }
    else {
      bVar8 = IsItemHovered(0);
      if (this != (ImDrawList *)0x0 && bVar8) {
        local_168[0].y = (window->Size).y + (window->Pos).y;
        local_168[0].x = (window->Size).x + (window->Pos).x;
        ImDrawList::AddRect(this,&window->Pos,(ImVec2 *)local_168,0xff00ffff,0.0,0,1.0);
      }
      if (!bVar7) {
        return;
      }
      if (window->WasActive == false) {
        TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");
      }
    }
    if (0 < iVar15) {
      pIVar13 = (draw_list->CmdBuffer).Data;
      local_1c0 = (long)iVar15 * 0x38;
      local_1c8 = draw_list;
      do {
        if (pIVar13->UserCallback == (ImDrawCallback)0x0) {
          ImFormatString(local_188,0x14,"0x%p",pIVar13->TextureId);
          ImFormatString((char *)local_168,300,
                         "DrawCmd:%5d tris, Tex %s, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                         SUB84((double)(pIVar13->ClipRect).x,0),
                         SUB84((double)(pIVar13->ClipRect).y,0),(double)(pIVar13->ClipRect).z,
                         (double)(pIVar13->ClipRect).w,(ulong)pIVar13->ElemCount / 3,local_188);
          bVar7 = TreeNode((void *)(((long)pIVar13 - (long)(draw_list->CmdBuffer).Data >> 3) *
                                   0x6db6db6db6db6db7),"%s",local_168);
          bVar8 = IsItemHovered(0);
          if (bVar8) {
            if ((pIVar5->DebugMetricsConfig).ShowDrawCmdMesh == false) {
              if ((this != (ImDrawList *)0x0) &&
                 ((pIVar5->DebugMetricsConfig).ShowDrawCmdBoundingBoxes != false)) {
                show_mesh = false;
                bVar8 = true;
                goto LAB_00195e20;
              }
            }
            else if (this != (ImDrawList *)0x0) {
              bVar8 = (pIVar5->DebugMetricsConfig).ShowDrawCmdBoundingBoxes;
              show_mesh = true;
LAB_00195e20:
              DebugNodeDrawCmdShowMeshAndBoundingBox(this,draw_list,pIVar13,show_mesh,bVar8);
            }
          }
          if (bVar7) {
            if ((draw_list->IdxBuffer).Size < 1) {
              puVar17 = (uint *)0x0;
            }
            else {
              puVar17 = (draw_list->IdxBuffer).Data;
            }
            uVar2 = pIVar13->VtxOffset;
            uVar12 = pIVar13->IdxOffset;
            pIVar4 = (draw_list->VtxBuffer).Data;
            uVar9 = pIVar13->ElemCount + uVar12;
            uVar19 = 0;
            if (uVar12 < uVar9) {
              fVar20 = 0.0;
              do {
                local_1f8._0_4_ = 0.0;
                local_1f8._4_4_ = 0.0;
                uStack_1f0._0_4_ = 0.0;
                uStack_1f0._4_4_ = 0.0;
                local_1e8._0_4_ = 0.0;
                local_1e8._4_4_ = 0.0;
                lVar16 = 0;
                do {
                  uVar14 = (uint)((ulong)uVar12 + lVar16);
                  if (puVar17 != (uint *)0x0) {
                    uVar14 = puVar17[(ulong)uVar12 + lVar16 & 0xffffffff];
                  }
                  *(ImVec2 *)(local_1f8 + lVar16 * 8) = pIVar4[(ulong)uVar2 + (ulong)uVar14].pos;
                  lVar16 = lVar16 + 1;
                } while (lVar16 != 3);
                fVar20 = fVar20 + ABS(((float)local_1f8._4_4_ - uStack_1f0._4_4_) * (float)local_1e8
                                      + (uStack_1f0._4_4_ - local_1e8._4_4_) *
                                        (float)local_1f8._0_4_ +
                                        (local_1e8._4_4_ - (float)local_1f8._4_4_) *
                                        (float)uStack_1f0) * 0.5;
                uVar12 = uVar12 + 3;
              } while (uVar12 < uVar9);
              uVar19 = SUB84((double)fVar20,0);
            }
            ImFormatString((char *)local_168,300,
                           "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px",
                           uVar19);
            local_1f8._0_4_ = 0.0;
            local_1f8._4_4_ = 0.0;
            Selectable((char *)local_168,false,0,(ImVec2 *)local_1f8);
            bVar7 = IsItemHovered(0);
            if (this != (ImDrawList *)0x0 && bVar7) {
              DebugNodeDrawCmdShowMeshAndBoundingBox(this,draw_list,pIVar13,true,false);
            }
            local_1d8 = 0.0;
            pvStack_1d0 = (void *)0x0;
            local_1e8._0_4_ = 0.0;
            local_1e8._4_4_ = 0.0;
            uStack_1e0._0_4_ = 0.0;
            uStack_1e0._4_4_ = 0;
            local_1f8._0_4_ = 0.0;
            local_1f8._4_4_ = 0.0;
            uStack_1f0._0_4_ = 0.0;
            uStack_1f0._4_4_ = 0.0;
            ImGuiListClipper::Begin((ImGuiListClipper *)local_1f8,pIVar13->ElemCount / 3,-1.0);
            while (bVar7 = ImGuiListClipper::Step((ImGuiListClipper *)local_1f8), bVar7) {
              if ((int)(float)uStack_1f0 < (int)uStack_1f0._4_4_) {
                uVar18 = (ulong)((int)(float)uStack_1f0 * 3 + pIVar13->IdxOffset);
                uVar12 = (uint)(float)uStack_1f0;
                do {
                  local_1b8 = (ulong)uVar12;
                  local_1a8[0].x = 0.0;
                  local_1a8[0].y = 0.0;
                  local_1a8[1].x = 0.0;
                  local_1a8[1].y = 0.0;
                  local_1a8[2].x = 0.0;
                  local_1a8[2].y = 0.0;
                  lVar16 = 0;
                  buf_00 = local_168;
                  do {
                    lVar1 = (uVar18 & 0xffffffff) + lVar16;
                    if (puVar17 == (uint *)0x0) {
                      uVar12 = (uint)lVar1;
                    }
                    else {
                      uVar12 = puVar17[(int)uVar18 + lVar16];
                    }
                    uVar10 = (ulong)uVar12;
                    local_1a8[lVar16] = pIVar4[uVar2 + uVar10].pos;
                    pcVar11 = "     ";
                    if (lVar16 == 0) {
                      pcVar11 = "Vert:";
                    }
                    iVar15 = ImFormatString((char *)buf_00,(size_t)(local_3c + -(long)buf_00),
                                            "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n"
                                            ,SUB84((double)pIVar4[uVar2 + uVar10].pos.x,0),
                                            SUB84((double)pIVar4[uVar2 + uVar10].pos.y,0),
                                            (double)pIVar4[uVar2 + uVar10].uv.x,
                                            (double)pIVar4[uVar2 + uVar10].uv.y,pcVar11,lVar1,
                                            (ulong)pIVar4[uVar2 + uVar10].col);
                    buf_00 = (ImVec4 *)((long)&buf_00->x + (long)iVar15);
                    lVar16 = lVar16 + 1;
                  } while (lVar16 != 3);
                  local_1b0.x = 0.0;
                  local_1b0.y = 0.0;
                  Selectable((char *)local_168,false,0,&local_1b0);
                  if ((this != (ImDrawList *)0x0) && (bVar7 = IsItemHovered(0), bVar7)) {
                    uVar12 = this->Flags;
                    this->Flags = uVar12 & 0xfffffffe;
                    ImDrawList::AddPolyline(this,local_1a8,3,0xff00ffff,1,1.0);
                    this->Flags = uVar12;
                  }
                  uVar18 = (uVar18 & 0xffffffff) + 3;
                  uVar12 = (int)local_1b8 + 1;
                } while ((int)uVar12 < (int)uStack_1f0._4_4_);
              }
            }
            TreePop();
            ImGuiListClipper::End((ImGuiListClipper *)local_1f8);
            draw_list = local_1c8;
          }
        }
        else {
          BulletText("Callback %p, user_data %p",pIVar13->UserCallback,pIVar13->UserCallbackData);
        }
        pIVar13 = pIVar13 + 1;
      } while (pIVar13 < (ImDrawCmd *)
                         ((long)&(((draw_list->CmdBuffer).Data)->ClipRect).x + local_1c0));
    }
  }
  TreePop();
  return;
}

Assistant:

void ImGui::DebugNodeDrawList(ImGuiWindow* window, ImGuiViewportP* viewport, const ImDrawList* draw_list, const char* label)
{
    ImGuiContext& g = *GImGui;
    IM_UNUSED(viewport); // Used in docking branch
    ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;
    int cmd_count = draw_list->CmdBuffer.Size;
    if (cmd_count > 0 && draw_list->CmdBuffer.back().ElemCount == 0 && draw_list->CmdBuffer.back().UserCallback == NULL)
        cmd_count--;
    bool node_open = TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, cmd_count);
    if (draw_list == GetWindowDrawList())
    {
        SameLine();
        TextColored(ImVec4(1.0f, 0.4f, 0.4f, 1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
        if (node_open)
            TreePop();
        return;
    }

    ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
    if (window && IsItemHovered() && fg_draw_list)
        fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!node_open)
        return;

    if (window && !window->WasActive)
        TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");

    for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.Data; pcmd < draw_list->CmdBuffer.Data + cmd_count; pcmd++)
    {
        if (pcmd->UserCallback)
        {
            BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
            continue;
        }

        char texid_desc[20];
        FormatTextureIDForDebugDisplay(texid_desc, IM_ARRAYSIZE(texid_desc), pcmd->TextureId);
        char buf[300];
        ImFormatString(buf, IM_ARRAYSIZE(buf), "DrawCmd:%5d tris, Tex %s, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
            pcmd->ElemCount / 3, texid_desc, pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
        bool pcmd_node_open = TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
        if (IsItemHovered() && (cfg->ShowDrawCmdMesh || cfg->ShowDrawCmdBoundingBoxes) && fg_draw_list)
            DebugNodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, cfg->ShowDrawCmdMesh, cfg->ShowDrawCmdBoundingBoxes);
        if (!pcmd_node_open)
            continue;

        // Calculate approximate coverage area (touched pixel count)
        // This will be in pixels squared as long there's no post-scaling happening to the renderer output.
        const ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
        const ImDrawVert* vtx_buffer = draw_list->VtxBuffer.Data + pcmd->VtxOffset;
        float total_area = 0.0f;
        for (unsigned int idx_n = pcmd->IdxOffset; idx_n < pcmd->IdxOffset + pcmd->ElemCount; )
        {
            ImVec2 triangle[3];
            for (int n = 0; n < 3; n++, idx_n++)
                triangle[n] = vtx_buffer[idx_buffer ? idx_buffer[idx_n] : idx_n].pos;
            total_area += ImTriangleArea(triangle[0], triangle[1], triangle[2]);
        }

        // Display vertex information summary. Hover to get all triangles drawn in wire-frame
        ImFormatString(buf, IM_ARRAYSIZE(buf), "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px", pcmd->ElemCount, pcmd->VtxOffset, pcmd->IdxOffset, total_area);
        Selectable(buf);
        if (IsItemHovered() && fg_draw_list)
            DebugNodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, true, false);

        // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
        ImGuiListClipper clipper;
        clipper.Begin(pcmd->ElemCount / 3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
        while (clipper.Step())
            for (int prim = clipper.DisplayStart, idx_i = pcmd->IdxOffset + clipper.DisplayStart * 3; prim < clipper.DisplayEnd; prim++)
            {
                char* buf_p = buf, * buf_end = buf + IM_ARRAYSIZE(buf);
                ImVec2 triangle[3];
                for (int n = 0; n < 3; n++, idx_i++)
                {
                    const ImDrawVert& v = vtx_buffer[idx_buffer ? idx_buffer[idx_i] : idx_i];
                    triangle[n] = v.pos;
                    buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                        (n == 0) ? "Vert:" : "     ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                }

                Selectable(buf, false);
                if (fg_draw_list && IsItemHovered())
                {
                    ImDrawListFlags backup_flags = fg_draw_list->Flags;
                    fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
                    fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), ImDrawFlags_Closed, 1.0f);
                    fg_draw_list->Flags = backup_flags;
                }
            }
        TreePop();
    }
    TreePop();
}